

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void linsolve(double *A,int N,double *b,int *ipiv,double *x)

{
  double *pdVar1;
  double *pdVar2;
  bool bVar3;
  double *__ptr;
  long lVar4;
  uint uVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  
  __ptr = (double *)malloc((long)N * 8);
  uVar12 = (ulong)(uint)N;
  if (N < 1) {
    *__ptr = b[*ipiv];
    bVar3 = false;
  }
  else {
    iVar11 = 0;
    uVar10 = 0;
    do {
      __ptr[uVar10] = 0.0;
      x[uVar10] = 0.0;
      if ((A[iVar11] == 0.0) && (!NAN(A[iVar11]))) {
        printf("Warning : The Matrix system does not have a unique solution");
      }
      uVar10 = uVar10 + 1;
      iVar11 = iVar11 + N + 1;
    } while (uVar12 != uVar10);
    *__ptr = b[*ipiv];
    bVar3 = uVar12 != 1;
    if (uVar12 == 1) {
      bVar3 = false;
    }
    else {
      pdVar7 = A + uVar12;
      uVar10 = 1;
      do {
        dVar13 = 0.0;
        uVar8 = 0;
        do {
          dVar13 = dVar13 + __ptr[uVar8] * pdVar7[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar10 != uVar8);
        __ptr[uVar10] = b[ipiv[uVar10]] - dVar13;
        uVar10 = uVar10 + 1;
        pdVar7 = pdVar7 + uVar12;
      } while (uVar10 != uVar12);
    }
  }
  uVar5 = N - 1;
  x[(int)uVar5] = __ptr[(int)uVar5] / A[(ulong)(uint)(N * N) - 1];
  if (bVar3) {
    uVar10 = (ulong)(N + 1);
    lVar4 = (long)(N + -2);
    pdVar6 = A + lVar4 * uVar10 + 1;
    pdVar7 = x + uVar5;
    uVar8 = 1;
    do {
      dVar13 = 0.0;
      if (lVar4 < (long)N + -1) {
        uVar9 = 0;
        do {
          pdVar1 = pdVar6 + uVar9;
          pdVar2 = pdVar7 + uVar9;
          uVar9 = uVar9 + 1;
          dVar13 = dVar13 + *pdVar1 * *pdVar2;
        } while (uVar8 != uVar9);
      }
      x[lVar4] = (__ptr[lVar4] - dVar13) / A[lVar4 * uVar10];
      lVar4 = lVar4 + -1;
      uVar8 = uVar8 + 1;
      pdVar6 = pdVar6 + -uVar10;
      pdVar7 = pdVar7 + -1;
    } while (uVar8 != uVar12);
  }
  free(__ptr);
  return;
}

Assistant:

void linsolve(double *A,int N,double *b,int *ipiv,double *x) {
	int i,j,c1,l;
	double *y;
	double sum;
	
	y = (double*) malloc(sizeof(double) *N);
	/*
	 * Two step Solution L * U * x = b
	 * Let U*x = y
	 * Solve L * y = b for y (Forward Substitution
	 * Solve U * x = b for x (Back Substitution)
	 */ 
	for(i = 0; i < N;++i) {
		y[i] = 0.;
		x[i] = 0.;
		if ( A[i*N + i] == 0.) {
			printf("Warning : The Matrix system does not have a unique solution");
			//exit(1);
		}
		//printf("\n B %d",ipiv[i]);
	}
	
	// Forward Substitution
	
	y[0] = b[ipiv[0]];
	for(i = 1; i < N; ++i) {
		sum = 0.;
		c1 = i*N;
		for(j = 0; j < i; ++j) {
			sum += y[j] * A[c1 + j];
		}
		y[i] = b[ipiv[i]] - sum;
	}
	
	// Back Substitution
	
	x[N - 1] = y[N - 1]/A[N * N - 1];
	
	for (i = N - 2; i >= 0; i--) {
		sum = 0.;
		c1 = i*(N+1);
		l=0;
		for(j = i+1; j < N;j++) {
			l++;
			sum += A[c1 + l] * x[j];
		}
		x[i] = (y[i] - sum) / A[c1];
	}
	
	free(y);
}